

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O3

void __thiscall
Address_NoSegwitAddressFromStringTest_Test::TestBody
          (Address_NoSegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  pointer __dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Address address;
  AssertHelper local_348;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  string local_338;
  undefined1 local_318 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  char local_2f8 [16];
  pointer local_2e8;
  pointer local_2d0;
  pointer local_2b8;
  TapBranch local_2a0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_228;
  Script local_210;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  Address local_1a0;
  
  cfd::core::Address::Address(&local_1a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn","");
      cfd::core::Address::Address((Address *)local_318,&local_338);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch(&local_2a0);
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x183,
               "Expected: (address = Address(\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_318,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,"\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",
             "address.GetAddress().c_str()","1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn",
             (char *)CONCAT71(local_318._1_7_,local_318[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_318._1_7_,local_318[0]) != &local_308) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_318._1_7_,local_318[0]));
  }
  if ((char)local_338._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)local_338._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_338._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x185,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_338._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = local_338._M_dataplus._M_p & 0xffffffff00000000;
  local_348.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kMainnet","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x186,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 2;
  local_348.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2pkhAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x187,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_348.data_._0_4_ = local_1a0.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersionNone","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x188,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    __dest = (pointer)0x0;
    sVar5 = 0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar3);
    sVar5 = (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_338.field_2._M_allocated_capacity = (size_type)(__dest + uVar3);
  local_338._M_dataplus._M_p = __dest;
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_338._M_string_length = (size_type)__dest;
    memmove(__dest,local_1a0.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_338._M_string_length = (size_type)(__dest + sVar5);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_318,(ByteData *)&local_338);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)CONCAT71(local_318._1_7_,local_318[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_318._1_7_,local_318[0]) != &local_308) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_318._1_7_,local_318[0]));
  }
  if (local_338._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x18a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = (pointer)0x0;
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_1a0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    sVar5 = 0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar3);
    sVar5 = (long)local_1a0.pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a0.pubkey_.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_338.field_2._M_allocated_capacity = uVar3 + (long)paVar2;
  local_338._M_dataplus._M_p = (pointer)paVar2;
  if (local_1a0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1a0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_338._M_string_length = (size_type)paVar2;
    memmove(paVar2,local_1a0.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  local_338._M_string_length = (long)paVar2 + sVar5;
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_318,(Pubkey *)&local_338);
  pcVar4 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)CONCAT71(local_318._1_7_,local_318[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_318._1_7_,local_318[0]) != &local_308) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_318._1_7_,local_318[0]));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x18b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_318,&local_1a0.redeem_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_338,(Script *)local_318);
  pcVar4 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"\"","address.GetScript().GetHex().c_str()","",
             local_338._M_dataplus._M_p);
  paVar2 = &local_338.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)local_318);
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x18c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc","");
      cfd::core::Address::Address((Address *)local_318,&local_338);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch(&local_2a0);
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x18e,
               "Expected: (address = Address(\"mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_318,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,"\"mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc\"",
             "address.GetAddress().c_str()","mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",
             (char *)CONCAT71(local_318._1_7_,local_318[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_318._1_7_,local_318[0]) != &local_308) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_318._1_7_,local_318[0]));
  }
  if ((char)local_338._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)local_338._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_338._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,400,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_338._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 1;
  local_348.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kTestnet","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x191,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 2;
  local_348.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2pkhAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x192,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG","");
      cfd::core::Address::Address((Address *)local_318,&local_338);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch(&local_2a0);
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x197,
               "Expected: (address = Address(\"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_318,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,"\"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG\"",
             "address.GetAddress().c_str()","3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG",
             (char *)CONCAT71(local_318._1_7_,local_318[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_318._1_7_,local_318[0]) != &local_308) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_318._1_7_,local_318[0]));
  }
  if ((char)local_338._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)local_338._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_338._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x199,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_338._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p = local_338._M_dataplus._M_p & 0xffffffff00000000;
  local_348.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kMainnet","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x19a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 1;
  local_348.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x19b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU","");
      cfd::core::Address::Address((Address *)local_318,&local_338);
      cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch(&local_2a0);
      if (local_2b8 != (pointer)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (pointer)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if ((char *)local_308._M_allocated_capacity != local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x19d,
               "Expected: (address = Address(\"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_318,&local_1a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,"\"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU\"",
             "address.GetAddress().c_str()","2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU",
             (char *)CONCAT71(local_318._1_7_,local_318[0]));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_318._1_7_,local_318[0]) != &local_308) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_318._1_7_,local_318[0]));
  }
  if ((char)local_338._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_318);
    if ((undefined8 *)local_338._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_338._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x19f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_338._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 1;
  local_348.data_._0_4_ = local_1a0.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kTestnet","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1a0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((long *)local_338._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_338._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338._M_dataplus._M_p._0_4_ = 1;
  local_348.data_._0_4_ = local_1a0.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_310.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_310.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1a1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_338._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_310,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_338._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHXfHU","");
    cfd::core::Address::Address((Address *)local_318,&local_338);
    cfd::core::Address::operator=(&local_1a0,(Address *)local_318);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1d0);
    cfd::core::Script::~Script(&local_210);
    local_2a0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006918c8;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_228);
    cfd::core::TapBranch::~TapBranch(&local_2a0);
    if (local_2b8 != (pointer)0x0) {
      operator_delete(local_2b8);
    }
    if (local_2d0 != (pointer)0x0) {
      operator_delete(local_2d0);
    }
    if (local_2e8 != (pointer)0x0) {
      operator_delete(local_2e8);
    }
    if ((char *)local_308._M_allocated_capacity != local_2f8) {
      operator_delete((void *)local_308._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)local_318);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x1a5,
             "Expected: (address = Address(\"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHXfHU\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_338,(Message *)local_318);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_338);
  if (CONCAT71(local_318._1_7_,local_318[0]) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)CONCAT71(local_318._1_7_,local_318[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_318._1_7_,local_318[0]) + 8))();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1a0.format_data_);
  cfd::core::Script::~Script(&local_1a0.redeem_script_);
  local_1a0.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006918c8;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1a0.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1a0.script_tree_.super_TapBranch);
  if (local_1a0.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.address_._M_dataplus._M_p != &local_1a0.address_.field_2) {
    operator_delete(local_1a0.address_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Address, NoSegwitAddressFromStringTest) {
  Address address;
  // P2PKH
  EXPECT_NO_THROW((address = Address("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn")));
  EXPECT_STREQ("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersionNone, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc")));
  EXPECT_STREQ("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());

  // regtest prefix is equals testnet prefix

  // P2SH
  EXPECT_NO_THROW((address = Address("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG")));
  EXPECT_STREQ("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2shAddress, address.GetAddressType());

  EXPECT_NO_THROW((address = Address("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU")));
  EXPECT_STREQ("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2shAddress, address.GetAddressType());

  // Illegal data
  EXPECT_THROW((address = Address("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHXfHU")),
               CfdException);
}